

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O2

void __thiscall test_app::test_app(test_app *this,service *srv)

{
  string *psVar1;
  allocator local_52;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  cppcms::application::application(&this->super_application,srv);
  *(undefined ***)this = &PTR__test_app_0011b788;
  (this->output_)._M_dataplus._M_p = (pointer)&(this->output_).field_2;
  (this->output_)._M_string_length = 0;
  (this->output_).field_2._M_local_buf[0] = '\0';
  this->srv_ = srv;
  psVar1 = (string *)cppcms::application::mapper();
  std::__cxx11::string::string(local_50,"foo",&local_51);
  std::__cxx11::string::string(local_30,"/foo",&local_52);
  cppcms::url_mapper::assign(psVar1,local_50);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  psVar1 = (string *)cppcms::application::mapper();
  std::__cxx11::string::string(local_50,"/",(allocator *)local_30);
  cppcms::url_mapper::assign(psVar1);
  std::__cxx11::string::~string(local_50);
  psVar1 = (string *)cppcms::application::mapper();
  std::__cxx11::string::string(local_50,"/{1}",(allocator *)local_30);
  cppcms::url_mapper::assign(psVar1);
  std::__cxx11::string::~string(local_50);
  psVar1 = (string *)cppcms::application::mapper();
  std::__cxx11::string::string(local_50,"/{1}/{2}",(allocator *)local_30);
  cppcms::url_mapper::assign(psVar1);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

test_app(cppcms::service &srv) : 
		cppcms::application(srv),
		srv_(srv)
	{
		mapper().assign("foo","/foo");
		mapper().assign("/");
		mapper().assign("/{1}");
		mapper().assign("/{1}/{2}");
	}